

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O3

uint solver_clause_create(solver_t *s,vec_uint_t *lits,uint f_learnt)

{
  long *plVar1;
  cdb *pcVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  vec_uint_t *pvVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  
  if (lits->size < 2) {
    __assert_fail("vec_uint_size(lits) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                  ,0x1e9,"unsigned int solver_clause_create(solver_t *, vec_uint_t *, unsigned int)"
                 );
  }
  if (1 < f_learnt) {
    __assert_fail("f_learnt == 0 || f_learnt == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                  ,0x1ea,"unsigned int solver_clause_create(solver_t *, vec_uint_t *, unsigned int)"
                 );
  }
  iVar10 = lits->size + f_learnt + 3;
  if (iVar10 == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/cdb.h"
                  ,0x47,"unsigned int cdb_append(struct cdb *, unsigned int)");
  }
  pcVar2 = s->all_clauses;
  uVar12 = pcVar2->size;
  uVar9 = pcVar2->cap;
  uVar11 = uVar12 + iVar10;
  uVar7 = uVar9;
  if (uVar9 < uVar11) {
    while (uVar7 < uVar11) {
      uVar7 = uVar7 + ((uVar7 >> 3) + (uVar7 >> 1) & 0xfffffffe) + 2;
      pcVar2->cap = uVar7;
      if (uVar7 < uVar9) {
        __assert_fail("p->cap >= prev_cap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/cdb.h"
                      ,0x2f,"void cdb_grow(struct cdb *, unsigned int)");
      }
    }
    puVar4 = (uint *)realloc(pcVar2->data,(ulong)uVar7 << 2);
    pcVar2->data = puVar4;
    uVar12 = pcVar2->size;
    uVar11 = iVar10 + uVar12;
  }
  pcVar2->size = uVar11;
  if (uVar11 <= uVar12) {
    __assert_fail("p->size > prev_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/cdb.h"
                  ,0x4b,"unsigned int cdb_append(struct cdb *, unsigned int)");
  }
  puVar4 = s->all_clauses->data;
  puVar5 = puVar4 + (ulong)uVar12 + 2;
  puVar5[-2] = (puVar5[-2] & 0xfffffff0) + f_learnt * 8 | f_learnt;
  uVar11 = lits->size;
  puVar5[-1] = uVar11;
  memcpy(puVar5,lits->data,(ulong)uVar11 << 2);
  if (f_learnt == 0) {
    pvVar6 = s->originals;
    uVar11 = pvVar6->size;
    uVar8 = (ulong)uVar11;
    if (uVar11 == pvVar6->cap) {
      if (uVar11 < 0x10) {
        puVar4 = (uint *)realloc(pvVar6->data,0x40);
        pvVar6->data = puVar4;
        uVar11 = 0x10;
        if (puVar4 == (uint *)0x0) goto LAB_009074f5;
      }
      else {
        if ((int)uVar11 < 1) goto LAB_0090742c;
        puVar4 = (uint *)realloc(pvVar6->data,uVar8 * 8);
        pvVar6->data = puVar4;
        if (puVar4 == (uint *)0x0) goto LAB_009074f5;
        uVar11 = uVar11 * 2;
      }
      pvVar6->cap = uVar11;
      uVar8 = (ulong)pvVar6->size;
    }
LAB_0090742c:
    pvVar6->data[uVar8] = uVar12;
    pvVar6->size = pvVar6->size + 1;
    plVar1 = &(s->stats).n_original_lits;
    *plVar1 = *plVar1 + (ulong)lits->size;
    return uVar12;
  }
  pvVar6 = s->learnts;
  uVar11 = pvVar6->size;
  uVar8 = (ulong)uVar11;
  if (uVar11 == pvVar6->cap) {
    if (uVar11 < 0x10) {
      puVar5 = (uint *)realloc(pvVar6->data,0x40);
      pvVar6->data = puVar5;
      uVar11 = 0x10;
      if (puVar5 == (uint *)0x0) {
LAB_009074f5:
        __assert_fail("p->data != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
      }
    }
    else {
      if ((int)uVar11 < 1) goto LAB_009072f9;
      puVar5 = (uint *)realloc(pvVar6->data,uVar8 * 8);
      pvVar6->data = puVar5;
      if (puVar5 == (uint *)0x0) goto LAB_009074f5;
      uVar11 = uVar11 * 2;
    }
    pvVar6->cap = uVar11;
    uVar8 = (ulong)pvVar6->size;
  }
LAB_009072f9:
  pvVar6->data[uVar8] = uVar12;
  pvVar6->size = pvVar6->size + 1;
  puVar5 = lits->data;
  uVar11 = lits->size;
  s->cur_stamp = s->cur_stamp + 1;
  if ((ulong)uVar11 == 0) {
    uVar11 = 0;
  }
  else {
    pvVar6 = s->levels;
    uVar8 = 0;
    iVar10 = 0;
    do {
      uVar9 = puVar5[uVar8] >> 1;
      if (pvVar6->size <= uVar9) {
LAB_0090745a:
        __assert_fail("idx >= 0 && idx < p->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0x85,"unsigned int vec_uint_at(vec_uint_t *, unsigned int)");
      }
      uVar9 = pvVar6->data[uVar9];
      if (s->stamps->size <= uVar9) goto LAB_0090745a;
      puVar3 = s->stamps->data;
      if (puVar3[uVar9] != s->cur_stamp) {
        puVar3[uVar9] = s->cur_stamp;
        iVar10 = iVar10 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
    uVar11 = iVar10 << 4;
  }
  puVar4 = puVar4 + uVar12;
  uVar9 = puVar4[1];
  *puVar4 = *puVar4 & 0xf | uVar11;
  puVar4[(ulong)uVar9 + 2] = 0;
  plVar1 = &(s->stats).n_learnt_lits;
  *plVar1 = *plVar1 + (ulong)lits->size;
  puVar4 = puVar4 + (ulong)uVar9 + 2;
  *puVar4 = *puVar4 + s->clause_act_inc;
  if ((int)*puVar4 < 0) {
    pvVar6 = s->learnts;
    if (pvVar6->size != 0) {
      uVar8 = 0;
      do {
        puVar4 = s->all_clauses->data;
        puVar4 = puVar4 + (ulong)pvVar6->data[uVar8] +
                          (ulong)puVar4[(ulong)pvVar6->data[uVar8] + 1] + 2;
        *puVar4 = *puVar4 >> 10;
        uVar8 = uVar8 + 1;
        pvVar6 = s->learnts;
      } while (uVar8 < pvVar6->size);
    }
    uVar9 = s->clause_act_inc >> 10;
    uVar11 = 0x800;
    if (0x800 < uVar9) {
      uVar11 = uVar9;
    }
    s->clause_act_inc = uVar11;
  }
  return uVar12;
}

Assistant:

unsigned solver_clause_create(solver_t *s, vec_uint_t *lits, unsigned f_learnt)
{
    struct clause *clause;
    unsigned cref;
    unsigned n_words;

    assert(vec_uint_size(lits) > 1);
    assert(f_learnt == 0 || f_learnt == 1);

    n_words = 3 + f_learnt + vec_uint_size(lits);
    cref = cdb_append(s->all_clauses, n_words);
    clause = clause_fetch(s, cref);
    clause->f_learnt = f_learnt;
    clause->f_mark = 0;
    clause->f_reallocd = 0;
    clause->f_deletable = f_learnt;
    clause->size = vec_uint_size(lits);
    memcpy(&(clause->data[0].lit), vec_uint_data(lits), sizeof(unsigned) * vec_uint_size(lits));

    if (f_learnt) {
        vec_uint_push_back(s->learnts, cref);
        clause->lbd = clause_clac_lbd(s, vec_uint_data(lits), vec_uint_size(lits));
        clause->data[clause->size].act = 0;
        s->stats.n_learnt_lits += vec_uint_size(lits);
        clause_act_bump(s, clause);
    } else {
        vec_uint_push_back(s->originals, cref);
        s->stats.n_original_lits += vec_uint_size(lits);
    }
    return cref;
}